

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::RepeatedWellKnownTypes::_InternalSerialize
          (RepeatedWellKnownTypes *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  ulong uVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Any>_> *value;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Api>_> *value_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Duration>_> *value_01;
  MessageLite *value_02;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldMask>_> *value_03;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceContext>_> *value_04;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Struct>_> *value_05;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Timestamp>_> *value_06;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Type>_> *value_07;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DoubleValue>_> *value_08;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FloatValue>_> *value_09;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Int64Value>_> *value_10;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UInt64Value>_> *value_11;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Int32Value>_> *value_12;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UInt32Value>_> *value_13;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::BoolValue>_> *value_14;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::StringValue>_> *value_15;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::BytesValue>_> *value_16;
  uint8_t *puVar3;
  int iVar4;
  
  iVar1 = *(int *)((long)&this->field_0 + 8);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Any>>
                      ((RepeatedPtrFieldBase *)&(this->field_0)._impl_,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (1,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x20);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Api>>
                         (&(this->field_0)._impl_.api_field_.super_RepeatedPtrFieldBase,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x38);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_01 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Duration>>
                         (&(this->field_0)._impl_.duration_field_.super_RepeatedPtrFieldBase,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (3,(MessageLite *)value_01,(value_01->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x50);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_02 = (MessageLite *)
               google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Empty>>
                         (&(this->field_0)._impl_.empty_field_.super_RepeatedPtrFieldBase,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (4,value_02,*(int *)&value_02[1]._vptr_MessageLite,target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x68);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_03 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldMask>>
                         (&(this->field_0)._impl_.field_mask_field_.super_RepeatedPtrFieldBase,iVar4
                         );
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (5,(MessageLite *)value_03,(value_03->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x80);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_04 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceContext>>
                         (&(this->field_0)._impl_.source_context_field_.super_RepeatedPtrFieldBase,
                          iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (6,(MessageLite *)value_04,(value_04->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x98);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_05 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Struct>>
                         (&(this->field_0)._impl_.struct_field_.super_RepeatedPtrFieldBase,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (7,(MessageLite *)value_05,(value_05->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0xb0);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_06 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Timestamp>>
                         (&(this->field_0)._impl_.timestamp_field_.super_RepeatedPtrFieldBase,iVar4)
    ;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (8,(MessageLite *)value_06,(value_06->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 200);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_07 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Type>>
                         (&(this->field_0)._impl_.type_field_.super_RepeatedPtrFieldBase,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (9,(MessageLite *)value_07,(value_07->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0xe0);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_08 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DoubleValue>>
                         (&(this->field_0)._impl_.double_field_.super_RepeatedPtrFieldBase,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (10,(MessageLite *)value_08,(value_08->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0xf8);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_09 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FloatValue>>
                         (&(this->field_0)._impl_.float_field_.super_RepeatedPtrFieldBase,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0xb,(MessageLite *)value_09,(value_09->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x110);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_10 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Int64Value>>
                         (&(this->field_0)._impl_.int64_field_.super_RepeatedPtrFieldBase,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0xc,(MessageLite *)value_10,(value_10->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x128);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_11 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UInt64Value>>
                         (&(this->field_0)._impl_.uint64_field_.super_RepeatedPtrFieldBase,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0xd,(MessageLite *)value_11,(value_11->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x140);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_12 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Int32Value>>
                         (&(this->field_0)._impl_.int32_field_.super_RepeatedPtrFieldBase,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0xe,(MessageLite *)value_12,(value_12->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x158);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_13 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UInt32Value>>
                         (&(this->field_0)._impl_.uint32_field_.super_RepeatedPtrFieldBase,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0xf,(MessageLite *)value_13,(value_13->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x170);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_14 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::BoolValue>>
                         (&(this->field_0)._impl_.bool_field_.super_RepeatedPtrFieldBase,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0x10,(MessageLite *)value_14,(value_14->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x188);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_15 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::StringValue>>
                         (&(this->field_0)._impl_.string_field_.super_RepeatedPtrFieldBase,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0x11,(MessageLite *)value_15,(value_15->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x1a0);
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    value_16 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::BytesValue>>
                         (&(this->field_0)._impl_.bytes_field_.super_RepeatedPtrFieldBase,iVar4);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0x12,(MessageLite *)value_16,(value_16->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL RepeatedWellKnownTypes::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const RepeatedWellKnownTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.RepeatedWellKnownTypes)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .google.protobuf.Any any_field = 1;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_any_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_any_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            1, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Api api_field = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_api_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_api_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Duration duration_field = 3;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_duration_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_duration_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            3, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Empty empty_field = 4;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_empty_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_empty_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            4, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.FieldMask field_mask_field = 5;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_field_mask_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_field_mask_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            5, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.SourceContext source_context_field = 6;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_source_context_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_source_context_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            6, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Struct struct_field = 7;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_struct_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_struct_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            7, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Timestamp timestamp_field = 8;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_timestamp_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_timestamp_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            8, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Type type_field = 9;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_type_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_type_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            9, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.DoubleValue double_field = 10;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_double_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_double_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            10, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.FloatValue float_field = 11;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_float_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_float_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            11, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Int64Value int64_field = 12;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_int64_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_int64_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            12, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.UInt64Value uint64_field = 13;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_uint64_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_uint64_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            13, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Int32Value int32_field = 14;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_int32_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_int32_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            14, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.UInt32Value uint32_field = 15;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_uint32_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_uint32_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            15, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.BoolValue bool_field = 16;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_bool_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_bool_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            16, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.StringValue string_field = 17;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_string_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_string_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            17, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.BytesValue bytes_field = 18;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_bytes_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_bytes_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            18, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.RepeatedWellKnownTypes)
  return target;
}